

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseEllipse(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    cVar2 = *this->m_current;
    if (((cVar2 == '\0') || (this->m_end < this->m_current)) || (2 < uVar3)) break;
    if (cVar2 != '.') {
      Error<>(this,"Expected ellipse");
      return;
    }
    uVar3 = uVar3 + 1;
    AdvanceCurrent(this);
  }
  ParseWhitespaceAndNewlines(this);
  pcVar1 = this->m_current;
  cVar2 = *pcVar1;
  if (cVar2 == '\r') {
    AdvanceCurrent(this);
    pcVar1 = this->m_current;
    cVar2 = *pcVar1;
  }
  if ((cVar2 == '\n') && (pcVar1 <= this->m_end)) {
    AdvanceCurrent(this);
    return;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEllipse()
	{
		int count = 0;
		while (!IsEndOfText() && count < 3)
		{
			char c = *m_current;
			if (c != '.')
			{
				Error("Expected ellipse");
				return;
			}
			++count;
			AdvanceCurrent();
		}
		ParseWhitespaceAndNewlines();
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
	}